

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::UnpackSnorm4x8CaseInstance::~UnpackSnorm4x8CaseInstance
          (UnpackSnorm4x8CaseInstance *this)

{
  UnpackSnorm4x8CaseInstance *this_local;
  
  ~UnpackSnorm4x8CaseInstance(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

UnpackSnorm4x8CaseInstance (Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, const char* name)
		: ShaderPackingFunctionTestInstance	(context, shaderType, spec, name)
	{
	}